

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readTags(WasmBinaryReader *this)

{
  size_t sVar1;
  uint32_t uVar2;
  ostream *poVar3;
  char *pcVar4;
  __node_base *p_Var5;
  __node_base_ptr *prefix;
  char *pcVar6;
  Name NVar7;
  Signature sig;
  Name name;
  Name name_00;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_ffffffffffffff28;
  undefined1 local_d0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  pair<wasm::Name,_bool> local_78;
  HeapType local_60;
  char *local_58;
  char *local_50;
  long local_48;
  wasm *local_40;
  long local_38;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> tag;
  
  uVar2 = getU32LEB(this);
  pcVar4 = (char *)(ulong)uVar2;
  local_48 = (long)(this->wasm->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->wasm->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_d0 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  local_40 = (wasm *)&this->tagNames;
  p_Var5 = &(this->tagNames)._M_h._M_before_begin;
  pcVar6 = pcVar4 + local_48;
  local_50 = pcVar4;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    if (pcVar6 <= (char *)(ulong)(uint)*(size_type *)(p_Var5 + 1)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "warning: tag index out of bounds in name section: ");
      name.super_IString.str._M_str = pcVar4;
      name.super_IString.str._M_len = (size_t)p_Var5[3]._M_nxt;
      poVar3 = wasm::operator<<((wasm *)poVar3,
                                *(ostream **)
                                 &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor,name);
      poVar3 = std::operator<<(poVar3," at index ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,'\n');
    }
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_d0,(value_type *)(p_Var5 + 2));
  }
  for (pcVar6 = (char *)0x0; prefix = &usedNames._M_h._M_single_bucket, local_50 != pcVar6;
      pcVar6 = pcVar6 + 1) {
    getInt8(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)prefix,"tag$",(allocator<char> *)&local_38);
    NVar7 = makeName((string *)prefix,(size_t)pcVar6);
    name_00.super_IString.str._M_str = local_d0;
    name_00.super_IString.str._M_len = (size_t)NVar7.super_IString.str._M_str;
    getOrMakeName(&local_78,local_40,
                  (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)(pcVar6 + local_48),(Index)NVar7.super_IString.str._M_len,name_00,
                  in_stack_ffffffffffffff28);
    local_58 = pcVar6;
    std::__cxx11::string::~string((string *)prefix);
    uVar2 = getU32LEB(this);
    pcVar6 = local_78.first.super_IString.str._M_str;
    sVar1 = local_78.first.super_IString.str._M_len;
    sig = getSignatureByTypeIndex(this,uVar2);
    HeapType::HeapType(&local_60,sig);
    NVar7.super_IString.str._M_str = (char *)sVar1;
    NVar7.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeTag(NVar7,(HeapType)pcVar6);
    *(bool *)(local_38 + 0x10) = local_78.second;
    Module::addTag(this->wasm,(unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
    pcVar6 = local_58;
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
              ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_d0);
  return;
}

Assistant:

void WasmBinaryReader::readTags() {
  size_t num = getU32LEB();
  auto numImports = wasm.tags.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : tagNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: tag index out of bounds in name section: " << name
                << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    getInt8(); // Reserved 'attribute' field
    auto [name, isExplicit] =
      getOrMakeName(tagNames, numImports + i, makeName("tag$", i), usedNames);
    auto typeIndex = getU32LEB();
    auto tag = Builder::makeTag(name, getSignatureByTypeIndex(typeIndex));
    tag->hasExplicitName = isExplicit;
    wasm.addTag(std::move(tag));
  }
}